

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

APInt __thiscall llvm::detail::IEEEFloat::convertF80LongDoubleAPFloatToAPInt(IEEEFloat *this)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  long *in_RSI;
  APInt AVar4;
  ArrayRef<unsigned_long> bigVal;
  uint64_t words [2];
  unsigned_long local_18;
  ulong local_10;
  undefined8 extraout_RDX;
  
  if ((undefined1 *)*in_RSI != semX87DoubleExtended) {
    __assert_fail("semantics == (const llvm::fltSemantics*)&semX87DoubleExtended",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xaf0,"APInt llvm::detail::IEEEFloat::convertF80LongDoubleAPFloatToAPInt() const"
                 );
  }
  bVar1 = *(byte *)((long)in_RSI + 0x12);
  uVar2 = bVar1 & 7;
  if (uVar2 == 3 || (bVar1 & 6) == 0) {
    if (uVar2 == 3) {
      local_10 = 0;
      local_18 = 0;
    }
    else {
      if (uVar2 == 1) {
        local_18 = *(unsigned_long *)in_RSI[1];
      }
      else {
        if ((bVar1 & 7) != 0) {
          __assert_fail("category == fcNaN && \"Unknown category\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                        ,0xb01,
                        "APInt llvm::detail::IEEEFloat::convertF80LongDoubleAPFloatToAPInt() const")
          ;
        }
        local_18 = 0x8000000000000000;
      }
      local_10 = 0x7fff;
    }
  }
  else {
    lVar3 = (long)(short)in_RSI[2] + 0x3fff;
    local_18 = *(unsigned_long *)in_RSI[1];
    uVar2 = (uint)(local_18 >> 0x3f);
    if (lVar3 != 1) {
      uVar2 = (uint)lVar3;
    }
    local_10 = (ulong)(uVar2 & 0x7fff);
  }
  local_10 = (bVar1 & 8) << 0xc | local_10;
  bigVal.Length = 2;
  bigVal.Data = &local_18;
  APInt::APInt((APInt *)this,0x50,bigVal);
  AVar4._8_8_ = extraout_RDX;
  AVar4.U.pVal = (uint64_t *)this;
  return AVar4;
}

Assistant:

APInt IEEEFloat::convertF80LongDoubleAPFloatToAPInt() const {
  assert(semantics == (const llvm::fltSemantics*)&semX87DoubleExtended);
  assert(partCount()==2);

  uint64_t myexponent, mysignificand;

  if (isFiniteNonZero()) {
    myexponent = exponent+16383; //bias
    mysignificand = significandParts()[0];
    if (myexponent==1 && !(mysignificand & 0x8000000000000000ULL))
      myexponent = 0;   // denormal
  } else if (category==fcZero) {
    myexponent = 0;
    mysignificand = 0;
  } else if (category==fcInfinity) {
    myexponent = 0x7fff;
    mysignificand = 0x8000000000000000ULL;
  } else {
    assert(category == fcNaN && "Unknown category");
    myexponent = 0x7fff;
    mysignificand = significandParts()[0];
  }

  uint64_t words[2];
  words[0] = mysignificand;
  words[1] =  ((uint64_t)(sign & 1) << 15) |
              (myexponent & 0x7fffLL);
  return APInt(80, words);
}